

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<HashWriter,char>
               (HashWriter *os,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<HashWriter>(os,str->_M_string_length);
  if (str->_M_string_length == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    CSHA256::Write(&os->ctx,(uchar *)(str->_M_dataplus)._M_p,str->_M_string_length);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::basic_string<C>& str)
{
    WriteCompactSize(os, str.size());
    if (!str.empty())
        os.write(MakeByteSpan(str));
}